

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O1

ConstTokenOrSyntax * __thiscall
slang::syntax::ModportSimplePortListSyntax::getChild
          (ConstTokenOrSyntax *__return_storage_ptr__,ModportSimplePortListSyntax *this,size_t index
          )

{
  Info *pIVar1;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *pSVar2;
  __index_type _Var3;
  
  if (index == 2) {
    pSVar2 = (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
             &(this->ports).super_SyntaxListBase;
LAB_003217e8:
    *(SyntaxNode **)
     &(__return_storage_ptr__->
      super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>).
      super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> =
         &(pSVar2->super_SyntaxListBase).super_SyntaxNode;
    _Var3 = '\x01';
  }
  else {
    if (index == 1) {
      pIVar1 = (this->direction).info;
      *(undefined8 *)
       &(__return_storage_ptr__->
        super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>).
        super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
        super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
        super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
        super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
        super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
        super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> =
           *(undefined8 *)&this->direction;
      *(Info **)((long)&(__return_storage_ptr__->
                        super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>).
                        super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                        .
                        super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                        .
                        super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                        .
                        super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                        .
                        super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                        .
                        super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                + 8) = pIVar1;
    }
    else {
      if (index == 0) {
        pSVar2 = &(this->super_MemberSyntax).attributes;
        goto LAB_003217e8;
      }
      parsing::Token::Token((Token *)__return_storage_ptr__);
    }
    _Var3 = '\0';
  }
  *(__index_type *)
   ((long)&(__return_storage_ptr__->
           super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>).
           super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> +
   0x10) = _Var3;
  return __return_storage_ptr__;
}

Assistant:

ConstTokenOrSyntax ModportSimplePortListSyntax::getChild(size_t index) const {
    switch (index) {
        case 0: return &attributes;
        case 1: return direction;
        case 2: return &ports;
        default: return nullptr;
    }
}